

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.c
# Opt level: O1

int luv_af_string_to_num(char *string)

{
  int iVar1;
  int iVar2;
  
  if (string == (char *)0x0) {
    return 0;
  }
  iVar1 = strcmp(string,"unix");
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = strcmp(string,"inet");
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = strcmp(string,"inet6");
      if (iVar1 == 0) {
        iVar1 = 10;
      }
      else {
        iVar1 = strcmp(string,"ipx");
        if (iVar1 == 0) {
          iVar1 = 4;
        }
        else {
          iVar1 = strcmp(string,"netlink");
          if (iVar1 == 0) {
            iVar1 = 0x10;
          }
          else {
            iVar1 = strcmp(string,"x25");
            if (iVar1 == 0) {
              iVar1 = 9;
            }
            else {
              iVar1 = strcmp(string,"ax25");
              if (iVar1 == 0) {
                iVar1 = 3;
              }
              else {
                iVar1 = strcmp(string,"atmpvc");
                if (iVar1 == 0) {
                  iVar1 = 8;
                }
                else {
                  iVar1 = strcmp(string,"appletalk");
                  if (iVar1 == 0) {
                    iVar1 = 5;
                  }
                  else {
                    iVar2 = strcmp(string,"packet");
                    iVar1 = 0x11;
                    if (iVar2 != 0) {
                      iVar1 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int luv_af_string_to_num(const char* string) {
  if (!string) return AF_UNSPEC;
#ifdef AF_UNIX
  if (strcmp(string, "unix") == 0) return AF_UNIX;
#endif
#ifdef AF_INET
  if (strcmp(string, "inet") == 0) return AF_INET;
#endif
#ifdef AF_INET6
  if (strcmp(string, "inet6") == 0) return AF_INET6;
#endif
#ifdef AF_IPX
  if (strcmp(string, "ipx") == 0) return AF_IPX;
#endif
#ifdef AF_NETLINK
  if (strcmp(string, "netlink") == 0) return AF_NETLINK;
#endif
#ifdef AF_X25
  if (strcmp(string, "x25") == 0) return AF_X25;
#endif
#ifdef AF_AX25
  if (strcmp(string, "ax25") == 0) return AF_AX25;
#endif
#ifdef AF_ATMPVC
  if (strcmp(string, "atmpvc") == 0) return AF_ATMPVC;
#endif
#ifdef AF_APPLETALK
  if (strcmp(string, "appletalk") == 0) return AF_APPLETALK;
#endif
#ifdef AF_PACKET
  if (strcmp(string, "packet") == 0) return AF_PACKET;
#endif
  return 0;
}